

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

ClauseStack * __thiscall
Inferences::InductionClauseIterator::produceClauses
          (InductionClauseIterator *this,Formula *hypothesis,InferenceRule rule,
          InductionContext *context,
          DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *bindings)

{
  bool bVar1;
  uint *puVar2;
  ostream *poVar3;
  InferenceRule in_CL;
  NewCNF *this_00;
  FormulaUnit *in_RDI;
  long in_R8;
  FormulaUnit *fu;
  value_type *kv;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range1;
  uint maxInductionDepth;
  Inference inf;
  NewCNF cnf;
  Stack<Kernel::Clause_*> *hyp_clauses;
  NonspecificInference0 *in_stack_fffffffffffffc98;
  Options *in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  Stack<Kernel::Clause_*> *in_stack_fffffffffffffcb0;
  Inference *in_stack_fffffffffffffce0;
  FormulaUnit *this_01;
  string local_2f8 [20];
  uint in_stack_fffffffffffffd1c;
  NewCNF *in_stack_fffffffffffffd20;
  uint local_2cc;
  reference local_2c8;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_2c0;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_2b8;
  long local_2b0;
  uint local_2a8;
  NonspecificInference0 local_2a2 [13];
  FormulaUnit *in_stack_fffffffffffffd78;
  FormulaUnit *in_stack_fffffffffffffd88;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffdf8;
  Stack<Kernel::Clause_*> *in_stack_fffffffffffffe00;
  FormulaUnit *in_stack_fffffffffffffe08;
  NewCNF *in_stack_fffffffffffffe10;
  
  this_01 = in_RDI;
  Shell::NewCNF::NewCNF(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
  Shell::NewCNF::setForInduction((NewCNF *)&stack0xfffffffffffffda0);
  Lib::Stack<Kernel::Clause_*>::Stack(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  Kernel::NonspecificInference0::NonspecificInference0(local_2a2,AXIOM,in_CL);
  Kernel::Inference::Inference((Inference *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  local_2a8 = 0;
  local_2b0 = in_R8 + 0x18;
  local_2b8._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::begin((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                *)in_stack_fffffffffffffc98);
  local_2c0._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::end((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
              *)in_stack_fffffffffffffc98);
  while (bVar1 = std::__detail::operator!=(&local_2b8,&local_2c0), bVar1) {
    local_2c8 = std::__detail::
                _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                             *)0x7d522e);
    in_stack_fffffffffffffce0 = Kernel::Unit::inference(&local_2c8->first->super_Unit);
    local_2cc = Kernel::Inference::inductionDepth(in_stack_fffffffffffffce0);
    puVar2 = std::max<unsigned_int>(&local_2a8,&local_2cc);
    local_2a8 = *puVar2;
    std::__detail::
    _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                  *)in_stack_fffffffffffffca0);
  }
  Kernel::Inference::setInductionDepth((Inference *)(local_2a2 + 1),local_2a8 + 1);
  Kernel::FormulaUnit::operator_new(0x7d5311);
  Kernel::FormulaUnit::FormulaUnit(this_01,(Formula *)in_RDI,in_stack_fffffffffffffce0);
  bVar1 = Shell::Options::showInduction(in_stack_fffffffffffffca0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[Induction] formula ");
    Kernel::FormulaUnit::toString_abi_cxx11_(in_stack_fffffffffffffd88);
    poVar3 = std::operator<<(poVar3,local_2f8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2f8);
  }
  Shell::NNF::ennf(in_stack_fffffffffffffd78);
  Shell::NewCNF::clausify
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  this_00 = (NewCNF *)(ulong)(byte)(in_CL + INTERNAL_GENERATING_INFERNCE_LAST);
  switch(this_00) {
  case (NewCNF *)0x0:
  case (NewCNF *)0x1:
  case (NewCNF *)0x2:
  case (NewCNF *)0x3:
    *(int *)(DAT_01333840 + 0x84) = *(int *)(DAT_01333840 + 0x84) + 1;
    break;
  case (NewCNF *)0x4:
  case (NewCNF *)0x5:
    *(int *)(DAT_01333840 + 0x8c) = *(int *)(DAT_01333840 + 0x8c) + 1;
    break;
  case (NewCNF *)0x6:
  case (NewCNF *)0x7:
    *(int *)(DAT_01333840 + 0x94) = *(int *)(DAT_01333840 + 0x94) + 1;
    break;
  case (NewCNF *)0x8:
  case (NewCNF *)0x9:
    *(int *)(DAT_01333840 + 0x9c) = *(int *)(DAT_01333840 + 0x9c) + 1;
  }
  switch(in_CL) {
  case INT_INF_UP_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xa4) = *(int *)(DAT_01333840 + 0xa4) + 1;
    break;
  case INT_INF_DOWN_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xbc) = *(int *)(DAT_01333840 + 0xbc) + 1;
    break;
  case INT_FIN_UP_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xac) = *(int *)(DAT_01333840 + 0xac) + 1;
    break;
  case INT_FIN_DOWN_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xc4) = *(int *)(DAT_01333840 + 0xc4) + 1;
    break;
  case INT_DB_UP_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xb4) = *(int *)(DAT_01333840 + 0xb4) + 1;
    break;
  case INT_DB_DOWN_INDUCTION_AXIOM:
    *(int *)(DAT_01333840 + 0xcc) = *(int *)(DAT_01333840 + 0xcc) + 1;
  }
  Kernel::Inference::~Inference((Inference *)(local_2a2 + 1));
  Shell::NewCNF::~NewCNF(this_00);
  return (ClauseStack *)this_01;
}

Assistant:

ClauseStack InductionClauseIterator::produceClauses(Formula* hypothesis, InferenceRule rule, const InductionContext& context, DHMap<unsigned, Term*>* bindings)
{
  NewCNF cnf(0);
  cnf.setForInduction();
  Stack<Clause*> hyp_clauses;
  Inference inf = NonspecificInference0(UnitInputType::AXIOM,rule);
  unsigned maxInductionDepth = 0;
  for (const auto& kv : context._cls) {
    maxInductionDepth = max(maxInductionDepth,kv.first->inference().inductionDepth());
  }
  inf.setInductionDepth(maxInductionDepth+1);
  FormulaUnit* fu = new FormulaUnit(hypothesis,inf);
  if(_opt.showInduction()){
    std::cout << "[Induction] formula " << fu->toString() << endl;
  }
  cnf.clausify(NNF::ennf(fu), hyp_clauses, bindings);

  switch (rule) {
    case InferenceRule::STRUCT_INDUCTION_AXIOM_ONE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_TWO:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_THREE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_RECURSION:
      env.statistics->structInduction++;
      break;
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBInduction++;
      break;
    default:
      ;
  }
  switch (rule) {
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
      env.statistics->intInfUpInduction++;
      break;
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfDownInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
      env.statistics->intFinUpInduction++;
      break;
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinDownInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
      env.statistics->intDBUpInduction++;
      break;
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBDownInduction++;
      break;
    default:
      ;
  }

  return hyp_clauses;
}